

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O3

scope scope_create(char *name)

{
  int iVar1;
  scope __ptr;
  size_t sVar2;
  char *pcVar3;
  set s;
  vector v;
  undefined8 *puVar4;
  size_t line;
  
  if (name == (char *)0x0) {
    pcVar3 = "Scope create invalid parameters";
    line = 0xa4;
  }
  else {
    __ptr = (scope)malloc(0x18);
    if (__ptr != (scope)0x0) {
      sVar2 = strlen(name);
      pcVar3 = (char *)malloc(sVar2 + 1);
      __ptr->name = pcVar3;
      if (pcVar3 == (char *)0x0) {
        log_write_impl_va("metacall",0x5b,"scope_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                          ,LOG_LEVEL_ERROR,"Scope create name bad allocation");
      }
      else {
        memcpy(pcVar3,name,sVar2 + 1);
        s = set_create(hash_callback_str,comparable_callback_str);
        __ptr->objects = s;
        if (s == (set)0x0) {
          log_write_impl_va("metacall",0x68,"scope_create",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                            ,LOG_LEVEL_ERROR,"Scope create map bad allocation");
        }
        else {
          v = vector_create(1);
          __ptr->call_stack = v;
          if (v == (vector)0x0) {
            log_write_impl_va("metacall",0x75,"scope_create",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                              ,LOG_LEVEL_ERROR,"Scope create call stack bad allocation");
          }
          else {
            iVar1 = vector_resize(v,8);
            if (iVar1 == 0) {
              puVar4 = (undefined8 *)vector_front(v);
              if (puVar4 != (undefined8 *)0x0) {
                *puVar4 = 0;
                return __ptr;
              }
              pcVar3 = "Scope create bad call stack head reference";
              line = 0x9a;
              goto LAB_0011e47a;
            }
            log_write_impl_va("metacall",0x82,"scope_create",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                              ,LOG_LEVEL_ERROR,"Scope create call stack bad allocation");
            vector_destroy(v);
          }
          set_destroy(s);
        }
        free(pcVar3);
      }
      free(__ptr);
      return (scope)0x0;
    }
    pcVar3 = "Scope create bad allocation";
    line = 0x9f;
  }
LAB_0011e47a:
  log_write_impl_va("metacall",line,"scope_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                    ,LOG_LEVEL_ERROR,pcVar3);
  return (scope)0x0;
}

Assistant:

scope scope_create(const char *name)
{
	if (name != NULL)
	{
		scope sp = malloc(sizeof(struct scope_type));

		if (sp != NULL)
		{
			size_t sp_name_size = strlen(name) + 1;

			size_t *call_stack_head = NULL;

			sp->name = malloc(sizeof(char) * sp_name_size);

			if (sp->name == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create name bad allocation");

				free(sp);

				return NULL;
			}

			memcpy(sp->name, name, sp_name_size);

			sp->objects = set_create(&hash_callback_str, &comparable_callback_str);

			if (sp->objects == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create map bad allocation");

				free(sp->name);

				free(sp);

				return NULL;
			}

			sp->call_stack = vector_create(sizeof(char));

			if (sp->call_stack == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create call stack bad allocation");

				set_destroy(sp->objects);

				free(sp->name);

				free(sp);

				return NULL;
			}

			if (vector_resize(sp->call_stack, sizeof(size_t)) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create call stack bad allocation");

				vector_destroy(sp->call_stack);

				set_destroy(sp->objects);

				free(sp->name);

				free(sp);

				return NULL;
			}

			call_stack_head = vector_front(sp->call_stack);

			if (call_stack_head != NULL)
			{
				const size_t head_index = 0;

				memcpy(call_stack_head, &head_index, sizeof(size_t));

				return sp;
			}

			log_write("metacall", LOG_LEVEL_ERROR, "Scope create bad call stack head reference");

			return NULL;
		}

		log_write("metacall", LOG_LEVEL_ERROR, "Scope create bad allocation");

		return NULL;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope create invalid parameters");

	return NULL;
}